

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btOptimizedBvhNode>::resize
          (btAlignedObjectArray<btOptimizedBvhNode> *this,int newsize,btOptimizedBvhNode *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  btOptimizedBvhNode *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  iVar2 = this->m_size;
  lVar12 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar11 = lVar12 << 6;
    for (; lVar12 < newsize; lVar12 = lVar12 + 1) {
      pbVar3 = this->m_data;
      uVar4 = *(undefined8 *)(fillData->m_aabbMinOrg).m_floats;
      uVar5 = *(undefined8 *)((fillData->m_aabbMinOrg).m_floats + 2);
      uVar6 = *(undefined8 *)(fillData->m_aabbMaxOrg).m_floats;
      uVar7 = *(undefined8 *)((fillData->m_aabbMaxOrg).m_floats + 2);
      uVar8 = *(undefined8 *)&fillData->m_escapeIndex;
      uVar9 = *(undefined8 *)&fillData->m_triangleIndex;
      uVar10 = *(undefined8 *)(fillData->m_padding + 0xc);
      *(undefined8 *)(pbVar3->m_padding + lVar11 + 4) = *(undefined8 *)(fillData->m_padding + 4);
      *(undefined8 *)(pbVar3->m_padding + lVar11 + 4 + 8) = uVar10;
      *(undefined8 *)(pbVar3->m_padding + lVar11 + -0xc) = uVar8;
      *(undefined8 *)(pbVar3->m_padding + lVar11 + -0xc + 8) = uVar9;
      puVar1 = (undefined8 *)((long)(pbVar3->m_aabbMaxOrg).m_floats + lVar11);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)(pbVar3->m_aabbMinOrg).m_floats + lVar11);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar11 = lVar11 + 0x40;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}